

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

uint256 * ParseHashV(uint256 *__return_storage_ptr__,UniValue *v,string_view name)

{
  long lVar1;
  string *args;
  UniValue *pUVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  size_type local_70;
  uint expected_len;
  string_view name_local;
  optional<uint256> rv;
  
  pcVar3 = name._M_str;
  name_local._M_len = name._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  name_local._M_str = pcVar3;
  args = UniValue::get_str_abi_cxx11_(v);
  str._M_str = pcVar3;
  str._M_len = (size_t)(args->_M_dataplus)._M_p;
  detail::FromHex<uint256>(&rv,(detail *)args->_M_string_length,str);
  if (rv.super__Optional_base<uint256,_true,_true>._M_payload.super__Optional_payload_base<uint256>.
      _M_engaged == true) {
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         rv.super__Optional_base<uint256,_true,_true>._M_payload.
         super__Optional_payload_base<uint256>._M_payload._16_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
         rv.super__Optional_base<uint256,_true,_true>._M_payload.
         super__Optional_payload_base<uint256>._M_payload._24_8_;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems =
         rv.super__Optional_base<uint256,_true,_true>._M_payload.
         super__Optional_payload_base<uint256>._M_payload._0_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) =
         rv.super__Optional_base<uint256,_true,_true>._M_payload.
         super__Optional_payload_base<uint256>._M_payload._8_8_;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    expected_len = 0x40;
    if (args->_M_string_length == 0x40) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                ((string *)&rv,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",
                 (char *)&name_local,(basic_string_view<char,_std::char_traits<char>_> *)args,in_R8)
      ;
      JSONRPCError(pUVar2,-8,(string *)&rv);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_70 = args->_M_string_length;
      tinyformat::
      format<std::basic_string_view<char,std::char_traits<char>>,unsigned_int,unsigned_long,std::__cxx11::string>
                ((string *)&rv,(tinyformat *)"%s must be of length %d (not %d, for \'%s\')",
                 (char *)&name_local,
                 (basic_string_view<char,_std::char_traits<char>_> *)&expected_len,(uint *)&local_70
                 ,(unsigned_long *)args,in_stack_ffffffffffffff88);
      JSONRPCError(pUVar2,-8,(string *)&rv);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

uint256 ParseHashV(const UniValue& v, std::string_view name)
{
    const std::string& strHex(v.get_str());
    if (auto rv{uint256::FromHex(strHex)}) return *rv;
    if (auto expected_len{uint256::size() * 2}; strHex.length() != expected_len) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be of length %d (not %d, for '%s')", name, expected_len, strHex.length(), strHex));
    }
    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
}